

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.cpp
# Opt level: O0

Class * __thiscall
cppgenerate::Class::addParentClass
          (Class *this,string *parentName,AccessModifier inheritanceType,string *initializer)

{
  undefined1 local_70 [8];
  Parent p;
  string *initializer_local;
  AccessModifier inheritanceType_local;
  string *parentName_local;
  Class *this_local;
  
  p._64_8_ = initializer;
  Parent::Parent((Parent *)local_70);
  std::__cxx11::string::operator=((string *)local_70,(string *)parentName);
  p._24_4_ = inheritanceType;
  std::__cxx11::string::operator=((string *)&p.inheritanceType,(string *)initializer);
  std::vector<cppgenerate::Class::Parent,_std::allocator<cppgenerate::Class::Parent>_>::push_back
            (&this->m_parents,(value_type *)local_70);
  Parent::~Parent((Parent *)local_70);
  return this;
}

Assistant:

Class& Class::addParentClass( std::string parentName, cppgenerate::AccessModifier inheritanceType, std::string initializer ){
    Parent p;
    p.parentName = parentName;
    p.inheritanceType = inheritanceType;
    p.initializer = initializer;
    m_parents.push_back( p );

    return *this;

}